

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cancellation_signal.hpp
# Opt level: O0

reactor_op_cancellation * __thiscall
asio::cancellation_slot::
emplace<asio::detail::reactive_socket_service_base::reactor_op_cancellation,asio::detail::epoll_reactor*,asio::detail::epoll_reactor::descriptor_state**,int&,asio::detail::epoll_reactor::op_types>
          (cancellation_slot *this,epoll_reactor **args,descriptor_state ***args_1,int *args_2,
          op_types *args_3)

{
  reactor_op_cancellation *prVar1;
  undefined8 *in_RDI;
  pair<void_*,_unsigned_long> pVar2;
  cancellation_handler_type *handler_obj;
  auto_delete_helper del;
  cancellation_handler<asio::detail::reactive_socket_service_base::reactor_op_cancellation> *this_00
  ;
  auto_delete_helper *in_stack_ffffffffffffffb0;
  descriptor_state ***in_stack_ffffffffffffffb8;
  cancellation_slot *in_stack_ffffffffffffffc0;
  
  pVar2 = prepare_memory(in_stack_ffffffffffffffc0,(size_t)in_stack_ffffffffffffffb8,
                         (size_t)in_stack_ffffffffffffffb0);
  this_00 = (cancellation_handler<asio::detail::reactive_socket_service_base::reactor_op_cancellation>
             *)pVar2.first;
  detail::cancellation_handler<asio::detail::reactive_socket_service_base::reactor_op_cancellation>
  ::
  cancellation_handler<asio::detail::epoll_reactor*,asio::detail::epoll_reactor::descriptor_state**,int&,asio::detail::epoll_reactor::op_types>
            ((cancellation_handler<asio::detail::reactive_socket_service_base::reactor_op_cancellation>
              *)pVar2.second,(size_t)this_00,(epoll_reactor **)in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffb8,(int *)in_stack_ffffffffffffffb0,(op_types *)this_00);
  *(cancellation_handler<asio::detail::reactive_socket_service_base::reactor_op_cancellation> **)
   *in_RDI = this_00;
  prVar1 = detail::
           cancellation_handler<asio::detail::reactive_socket_service_base::reactor_op_cancellation>
           ::handler(this_00);
  auto_delete_helper::~auto_delete_helper(in_stack_ffffffffffffffb0);
  return prVar1;
}

Assistant:

CancellationHandler& emplace(ASIO_MOVE_ARG(Args)... args)
  {
    typedef detail::cancellation_handler<CancellationHandler>
      cancellation_handler_type;
    auto_delete_helper del = { prepare_memory(
        sizeof(cancellation_handler_type),
        ASIO_ALIGNOF(CancellationHandler)) };
    cancellation_handler_type* handler_obj =
      new (del.mem.first) cancellation_handler_type(
        del.mem.second, ASIO_MOVE_CAST(Args)(args)...);
    del.mem.first = 0;
    *handler_ = handler_obj;
    return handler_obj->handler();
  }